

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void assign_tensor(TENSOR *tensor,float **buf,int channels,int width,int height,int stride)

{
  int c_1;
  int c;
  int stride_local;
  int height_local;
  int width_local;
  int channels_local;
  float **buf_local;
  TENSOR *tensor_local;
  
  tensor->allocsize = 0;
  tensor->channels = channels;
  tensor->width = width;
  tensor->height = height;
  tensor->stride = stride;
  if (buf == (float **)0x0) {
    for (c_1 = 0; c_1 < channels; c_1 = c_1 + 1) {
      tensor->buf[c_1] = (float *)0x0;
    }
  }
  else {
    for (c = 0; c < channels; c = c + 1) {
      tensor->buf[c] = buf[c];
    }
  }
  return;
}

Assistant:

static void assign_tensor(TENSOR *tensor, float *buf[CNN_MAX_CHANNELS],
                          int channels, int width, int height, int stride) {
  tensor->allocsize = 0;
  tensor->channels = channels;
  tensor->width = width;
  tensor->height = height;
  tensor->stride = stride;
  if (buf) {
    for (int c = 0; c < channels; ++c) tensor->buf[c] = buf[c];
  } else {
    for (int c = 0; c < channels; ++c) tensor->buf[c] = NULL;
  }
}